

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayalgorithms.h
# Opt level: O2

size_t qstrlen(char *str)

{
  size_t sVar1;
  
  if (str == (char *)0x0) {
    return 0;
  }
  sVar1 = strlen(str);
  return sVar1;
}

Assistant:

inline size_t qstrlen(const char *str)
{
    QT_WARNING_PUSH
#if defined(Q_CC_GNU_ONLY) && Q_CC_GNU >= 900 && Q_CC_GNU < 1000
    // spurious compiler warning (https://gcc.gnu.org/bugzilla/show_bug.cgi?id=91490#c6)
    // when Q_DECLARE_METATYPE_TEMPLATE_1ARG is used
    QT_WARNING_DISABLE_GCC("-Wstringop-overflow")
#endif
    return str ? strlen(str) : 0;
    QT_WARNING_POP
}